

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtranslator.cpp
# Opt level: O3

QString * __thiscall
QTranslatorPrivate::do_translate
          (QString *__return_storage_ptr__,QTranslatorPrivate *this,char *context,char *sourceText,
          char *comment,int n)

{
  uchar *__s1;
  ushort uVar1;
  uint uVar2;
  ushort *puVar3;
  uchar *puVar4;
  uint *puVar5;
  qsizetype alloc;
  pointer puVar6;
  QTranslator *pQVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  Data *pDVar14;
  ushort uVar15;
  uint *puVar16;
  byte *pbVar17;
  uint *puVar18;
  bool bVar19;
  uint uVar20;
  unique_ptr<QTranslator,_std::default_delete<QTranslator>_> *translator;
  uchar *puVar21;
  pointer puVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  uint *puVar26;
  byte bVar27;
  byte bVar28;
  uint uVar29;
  byte *pbVar30;
  uint uVar31;
  int local_ac;
  ulong local_88;
  uchar *local_80;
  int local_74;
  uint local_70;
  uint local_68;
  uint local_60;
  
  if (context == (char *)0x0) {
    context = "";
  }
  if (sourceText == (char *)0x0) {
    sourceText = "";
  }
  if (comment == (char *)0x0) {
    comment = "";
  }
  uVar2 = this->offsetLength;
  if (uVar2 != 0) {
    if (this->contextLength != 0) {
      puVar3 = (ushort *)this->contextArray;
      uVar15 = *puVar3 << 8 | *puVar3 >> 8;
      bVar23 = *context;
      if (bVar23 == 0) {
LAB_002cbc76:
        uVar8 = 1;
      }
      else {
        uVar8 = 0;
        pbVar17 = (byte *)context;
        do {
          pbVar17 = pbVar17 + 1;
          uVar24 = (uint)bVar23 + uVar8 * 0x10;
          uVar8 = uVar24 & 0xf0000000;
          uVar8 = ~uVar8 & (uVar8 >> 0x18 ^ uVar24);
          bVar23 = *pbVar17;
        } while (bVar23 != 0);
        if (uVar8 == 0) goto LAB_002cbc76;
      }
      uVar1 = puVar3[(ulong)uVar8 % (ulong)uVar15 + 1];
      if (uVar1 != 0) {
        uVar25 = (ulong)((uint)(ushort)(uVar1 << 8 | uVar1 >> 8) + (uint)uVar15);
        sVar10 = strlen(context);
        bVar23 = (byte)puVar3[uVar25 + 1];
        if (bVar23 != 0) {
          pbVar17 = (byte *)((long)puVar3 + uVar25 * 2 + 3);
          do {
            uVar8 = bVar23 - 1;
            if (pbVar17[uVar8] != 0) {
              uVar8 = (uint)bVar23;
            }
            if ((uVar8 == (uint)sVar10) &&
               (iVar9 = bcmp(pbVar17,context,sVar10 & 0xffffffff), iVar9 == 0)) goto LAB_002cbd06;
            pbVar30 = pbVar17 + bVar23;
            pbVar17 = pbVar30 + 1;
            bVar23 = *pbVar30;
          } while (bVar23 != 0);
        }
      }
      goto LAB_002cc35d;
    }
LAB_002cbd06:
    if (7 < uVar2) {
      local_ac = 0;
      pbVar17 = (byte *)comment;
      if ((-1 < n) && (this->numerusRulesLength != 0)) {
        puVar4 = this->numerusRulesArray;
        uVar8 = 0;
        local_ac = 0;
        while( true ) {
          bVar23 = 0;
          do {
            bVar27 = bVar23;
            bVar28 = 1;
            do {
              bVar23 = puVar4[uVar8];
              uVar24 = (uint)n % 10;
              if (((((bVar23 & 0x10) == 0) && (uVar24 = (uint)n % 100, (bVar23 & 0x20) == 0)) &&
                  (uVar24 = n, 999 < (uint)n)) && (uVar20 = n, (bVar23 & 0x40) != 0)) {
                do {
                  uVar24 = uVar20 / 1000;
                  bVar19 = 999999 < uVar20;
                  uVar20 = uVar20 / 1000;
                } while (bVar19);
              }
              uVar29 = bVar23 & 7;
              uVar20 = uVar8 + 2;
              uVar25 = (ulong)uVar20;
              if (uVar29 - 1 < 4) {
                uVar31 = (uint)puVar4[uVar8 + 1];
                switch(uVar29) {
                case 1:
                  bVar19 = uVar24 == puVar4[uVar8 + 1];
                  break;
                case 2:
                  bVar19 = (int)uVar24 < (int)uVar31;
                  break;
                case 3:
                  bVar19 = (int)uVar24 <= (int)uVar31;
                  break;
                case 4:
                  uVar20 = uVar8 + 3;
                  bVar19 = (int)uVar24 <= (int)(uint)puVar4[uVar25] && (int)uVar31 <= (int)uVar24;
                }
              }
              else {
                bVar19 = true;
              }
              bVar28 = bVar28 & ((byte)((bVar23 & 8) >> 3) ^ bVar19);
              if (uVar20 == this->numerusRulesLength) {
                local_ac = local_ac + ((byte)~(bVar27 | bVar28) & 1);
                goto LAB_002cbec3;
              }
              uVar8 = uVar20 + 1;
            } while (puVar4[uVar20] == 0xfd);
            bVar23 = bVar27 | bVar28;
          } while (puVar4[uVar20] == 0xfe);
          if (bVar27 != 0 || bVar28 != 0) break;
          local_ac = local_ac + 1;
        }
      }
LAB_002cbec3:
      do {
        comment = (char *)pbVar17;
        bVar23 = *sourceText;
        uVar8 = 0;
        if (bVar23 != 0) {
          uVar8 = 0;
          pbVar17 = (byte *)sourceText;
          do {
            pbVar17 = pbVar17 + 1;
            uVar8 = (uint)bVar23 + uVar8 * 0x10;
            uVar24 = uVar8 & 0xf0000000;
            uVar8 = ~uVar24 & (uVar24 >> 0x18 ^ uVar8);
            bVar23 = *pbVar17;
          } while (bVar23 != 0);
        }
        bVar23 = *comment;
        bVar27 = bVar23;
        pbVar17 = (byte *)comment;
        while (bVar27 != 0) {
          pbVar17 = pbVar17 + 1;
          uVar8 = (uint)bVar27 + uVar8 * 0x10;
          uVar24 = uVar8 & 0xf0000000;
          uVar8 = ~uVar24 & (uVar24 >> 0x18 ^ uVar8);
          bVar27 = *pbVar17;
        }
        uVar8 = uVar8 + (uVar8 == 0);
        puVar5 = (uint *)this->offsetArray;
        puVar18 = (uint *)((long)puVar5 + ((ulong)(uVar2 & 0xfffffff8) - 8));
        puVar26 = puVar5;
        do {
          puVar16 = puVar26;
          if (puVar18 < puVar16) goto LAB_002cbf9c;
          uVar25 = (long)puVar18 - (long)puVar16 >> 1 & 0xfffffffffffffff8;
          uVar24 = *(uint *)((long)puVar16 + uVar25);
          uVar24 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                   uVar24 << 0x18;
          puVar26 = (uint *)((long)puVar16 + uVar25) + 2;
          if (uVar8 <= uVar24) {
            puVar26 = puVar16;
          }
          if (uVar8 < uVar24) {
            puVar18 = (uint *)((long)puVar16 + (uVar25 - 8));
          }
        } while (uVar24 != uVar8);
        puVar16 = (uint *)((long)puVar16 + uVar25);
LAB_002cbf9c:
        if (puVar16 <= puVar18) {
          do {
            puVar26 = puVar16;
            puVar18 = puVar5;
            if (puVar26 == puVar5) break;
            puVar16 = puVar26 + -2;
            puVar18 = puVar26;
          } while (*puVar26 == puVar26[-2]);
          for (; (puVar18 < this->offsetArray + this->offsetLength &&
                 (uVar24 = *puVar18,
                 (uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                 uVar24 << 0x18) == uVar8)); puVar18 = puVar18 + 2) {
            uVar24 = puVar18[1];
            uVar20 = uVar24 >> 0x18 | (uVar24 & 0xff0000) >> 8 | (uVar24 & 0xff00) << 8 |
                     uVar24 << 0x18;
            (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            puVar4 = this->messageArray;
            uVar24 = this->messageLength;
            sVar10 = strlen(sourceText);
            sVar11 = strlen(context);
            sVar12 = strlen(comment);
            if (uVar20 < uVar24) {
              puVar21 = puVar4 + uVar20;
              local_80 = (uchar *)0x0;
              local_74 = local_ac;
              local_88 = 0;
              do {
                switch(*puVar21) {
                case '\x01':
                  if (local_80 != (uchar *)0x0) {
                    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    QString::QString(__return_storage_ptr__,local_88 >> 1,Uninitialized);
                    pDVar14 = (__return_storage_ptr__->d).d;
                    alloc = (__return_storage_ptr__->d).size;
                    if ((pDVar14 == (Data *)0x0) ||
                       (1 < (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)
                       ) {
                      QString::reallocData(__return_storage_ptr__,alloc,KeepSize);
                    }
                    qbswap<2>(local_80,alloc,(__return_storage_ptr__->d).ptr);
                    if ((__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
                      return __return_storage_ptr__;
                    }
                    pDVar14 = (__return_storage_ptr__->d).d;
                    goto LAB_002cc204;
                  }
                default:
                  goto switchD_002cc0b1_caseD_2;
                case '\x03':
                  uVar20 = *(uint *)(puVar21 + 1);
                  uVar29 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                           uVar20 << 0x18;
                  if ((uVar20 >> 0x18 & 1) != 0) goto switchD_002cc0b1_caseD_2;
                  bVar19 = local_74 == 0;
                  local_74 = local_74 + -1;
                  if (bVar19) {
                    local_88 = (ulong)uVar29;
                    local_80 = puVar21 + 5;
                  }
                  puVar21 = puVar21 + (long)(int)uVar29 + 5;
                  break;
                case '\x05':
                  puVar21 = puVar21 + 5;
                  break;
                case '\x06':
                  uVar20 = *(uint *)(puVar21 + 1);
                  uVar29 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                           uVar20 << 0x18;
                  if (uVar20 == 0) {
                    uVar20 = 0;
                  }
                  else {
                    uVar20 = uVar29 - 1;
                    if (puVar21[(ulong)(uVar29 - 1) + 5] != '\0') {
                      uVar20 = uVar29;
                    }
                  }
                  local_60 = (uint)sVar10;
                  pbVar17 = (byte *)sourceText;
                  sVar13 = sVar10;
                  if (uVar20 == local_60) goto LAB_002cc1a9;
                  goto switchD_002cc0b1_caseD_2;
                case '\a':
                  uVar20 = *(uint *)(puVar21 + 1);
                  uVar29 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                           uVar20 << 0x18;
                  if (uVar20 == 0) {
                    uVar20 = 0;
                  }
                  else {
                    uVar20 = uVar29 - 1;
                    if (puVar21[(ulong)(uVar29 - 1) + 5] != '\0') {
                      uVar20 = uVar29;
                    }
                  }
                  local_68 = (uint)sVar11;
                  pbVar17 = (byte *)context;
                  sVar13 = sVar11;
                  if (uVar20 != local_68) goto switchD_002cc0b1_caseD_2;
LAB_002cc1a9:
                  iVar9 = bcmp(puVar21 + 5,pbVar17,sVar13 & 0xffffffff);
                  if (iVar9 != 0) goto switchD_002cc0b1_caseD_2;
                  puVar21 = puVar21 + 5 + uVar29;
                  break;
                case '\b':
                  uVar20 = *(uint *)(puVar21 + 1);
                  uVar29 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 |
                           uVar20 << 0x18;
                  __s1 = puVar21 + 5;
                  if (puVar21[5] != '\0') {
                    if (uVar20 == 0) {
                      uVar20 = 0;
                    }
                    else {
                      uVar20 = uVar29 - 1;
                      if (__s1[uVar29 - 1] != '\0') {
                        uVar20 = uVar29;
                      }
                    }
                    local_70 = (uint)sVar12;
                    if ((uVar20 != local_70) ||
                       (iVar9 = bcmp(__s1,comment,sVar12 & 0xffffffff), iVar9 != 0)) {
                      (__return_storage_ptr__->d).d = (Data *)0x0;
                      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
                      (__return_storage_ptr__->d).size = 0;
                      pDVar14 = (Data *)0x0;
                      goto LAB_002cc204;
                    }
                  }
                  puVar21 = __s1 + uVar29;
                }
              } while (puVar21 < puVar4 + uVar24);
            }
switchD_002cc0b1_caseD_2:
            (__return_storage_ptr__->d).d = (Data *)0x0;
            (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
            (__return_storage_ptr__->d).size = 0;
            pDVar14 = (Data *)0x0;
LAB_002cc204:
            if (pDVar14 != (Data *)0x0) {
              LOCK();
              (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
              }
            }
          }
          bVar23 = *comment;
        }
        pbVar17 = (byte *)0x4d2ec9;
      } while (bVar23 != 0);
    }
  }
  puVar6 = (this->subTranslators).
           super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar22 = (this->subTranslators).
                 super__Vector_base<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>,_std::allocator<std::unique_ptr<QTranslator,_std::default_delete<QTranslator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar22 != puVar6; puVar22 = puVar22 + 1
      ) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
    pQVar7 = (puVar22->_M_t).super___uniq_ptr_impl<QTranslator,_std::default_delete<QTranslator>_>.
             _M_t.super__Tuple_impl<0UL,_QTranslator_*,_std::default_delete<QTranslator>_>.
             super__Head_base<0UL,_QTranslator_*,_false>._M_head_impl;
    (**(code **)((long)(pQVar7->super_QObject)._vptr_QObject + 0x60))
              (__return_storage_ptr__,pQVar7,context,sourceText,comment,n);
    if ((__return_storage_ptr__->d).ptr != (char16_t *)0x0) {
      return __return_storage_ptr__;
    }
    pDVar14 = (__return_storage_ptr__->d).d;
    if (pDVar14 != (Data *)0x0) {
      LOCK();
      (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar14->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
  }
LAB_002cc35d:
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  return __return_storage_ptr__;
}

Assistant:

QString QTranslatorPrivate::do_translate(const char *context, const char *sourceText,
                                         const char *comment, int n) const
{
    if (context == nullptr)
        context = "";
    if (sourceText == nullptr)
        sourceText = "";
    if (comment == nullptr)
        comment = "";

    uint numerus = 0;
    size_t numItems = 0;

    if (!offsetLength)
        goto searchDependencies;

    /*
        Check if the context belongs to this QTranslator. If many
        translators are installed, this step is necessary.
    */
    if (contextLength) {
        quint16 hTableSize = read16(contextArray);
        uint g = elfHash(context) % hTableSize;
        const uchar *c = contextArray + 2 + (g << 1);
        quint16 off = read16(c);
        c += 2;
        if (off == 0)
            return QString();
        c = contextArray + (2 + (hTableSize << 1) + (off << 1));

        const uint contextLen = uint(strlen(context));
        for (;;) {
            quint8 len = read8(c++);
            if (len == 0)
                return QString();
            if (match(c, len, context, contextLen))
                break;
            c += len;
        }
    }

    numItems = offsetLength / (2 * sizeof(quint32));
    if (!numItems)
        goto searchDependencies;

    if (n >= 0)
        numerus = numerusHelper(n, numerusRulesArray, numerusRulesLength);

    for (;;) {
        quint32 h = 0;
        elfHash_continue(sourceText, h);
        elfHash_continue(comment, h);
        elfHash_finish(h);

        const uchar *start = offsetArray;
        const uchar *end = start + ((numItems - 1) << 3);
        while (start <= end) {
            const uchar *middle = start + (((end - start) >> 4) << 3);
            uint hash = read32(middle);
            if (h == hash) {
                start = middle;
                break;
            } else if (hash < h) {
                start = middle + 8;
            } else {
                end = middle - 8;
            }
        }

        if (start <= end) {
            // go back on equal key
            while (start != offsetArray && read32(start) == read32(start - 8))
                start -= 8;

            while (start < offsetArray + offsetLength) {
                quint32 rh = read32(start);
                start += 4;
                if (rh != h)
                    break;
                quint32 ro = read32(start);
                start += 4;
                QString tn = getMessage(messageArray + ro, messageArray + messageLength, context,
                                        sourceText, comment, numerus);
                if (!tn.isNull())
                    return tn;
            }
        }
        if (!comment[0])
            break;
        comment = "";
    }

searchDependencies:
    for (const auto &translator : subTranslators) {
        QString tn = translator->translate(context, sourceText, comment, n);
        if (!tn.isNull())
            return tn;
    }
    return QString();
}